

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_elements_address.cpp
# Opt level: O0

void __thiscall
ElementsAddressFactory_GetAddress_Test::TestBody(ElementsAddressFactory_GetAddress_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  char *pcVar3;
  CfdException *anon_var_0_2;
  bool gtest_caught_expected_2;
  ConstCharPtr gtest_msg_2;
  CfdException *anon_var_0_1;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  CfdException *anon_var_0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  AssertionResult gtest_ar_1;
  Address address2;
  AssertionResult gtest_ar;
  Address address;
  ElementsAddressFactory factory;
  undefined6 in_stack_fffffffffffff630;
  undefined1 in_stack_fffffffffffff636;
  undefined1 in_stack_fffffffffffff637;
  AddressFactory *in_stack_fffffffffffff638;
  undefined6 in_stack_fffffffffffff640;
  undefined1 in_stack_fffffffffffff646;
  undefined1 in_stack_fffffffffffff647;
  AssertHelper local_970;
  Message local_968 [2];
  allocator local_951;
  string local_950 [415];
  byte local_7b1;
  ConstCharPtr local_7b0;
  AssertHelper local_7a8;
  Message local_7a0 [2];
  undefined1 local_789 [416];
  byte local_5e9;
  ConstCharPtr local_5e8;
  AssertHelper local_5e0;
  Message local_5d8 [2];
  allocator local_5c1;
  string local_5c0 [415];
  byte local_421;
  ConstCharPtr local_420;
  AssertHelper local_418;
  Message local_410;
  string local_408;
  AssertionResult local_3e8;
  allocator local_3d1;
  string local_3d0 [32];
  Address local_3b0;
  AssertHelper local_238;
  Message local_230;
  string local_228;
  AssertionResult local_208;
  allocator local_1f1;
  string local_1f0 [32];
  Address local_1d0;
  
  cfd::core::GetElementsAddressFormatList();
  cfd::ElementsAddressFactory::ElementsAddressFactory
            ((ElementsAddressFactory *)
             CONCAT17(in_stack_fffffffffffff647,
                      CONCAT16(in_stack_fffffffffffff646,in_stack_fffffffffffff640)),
             (NetType)((ulong)in_stack_fffffffffffff638 >> 0x20),
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             CONCAT17(in_stack_fffffffffffff637,
                      CONCAT16(in_stack_fffffffffffff636,in_stack_fffffffffffff630)));
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             CONCAT17(in_stack_fffffffffffff647,
                      CONCAT16(in_stack_fffffffffffff646,in_stack_fffffffffffff640)));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,"XVHzywLC5fPS8N1216n3b2fngqqrPzKYx9",&local_1f1);
  cfd::AddressFactory::GetAddress
            (in_stack_fffffffffffff638,
             (string *)
             CONCAT17(in_stack_fffffffffffff637,
                      CONCAT16(in_stack_fffffffffffff636,in_stack_fffffffffffff630)));
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_228,&local_1d0);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_208,"address.GetAddress().c_str()",
             "\"XVHzywLC5fPS8N1216n3b2fngqqrPzKYx9\"",pcVar3,"XVHzywLC5fPS8N1216n3b2fngqqrPzKYx9");
  std::__cxx11::string::~string((string *)&local_228);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_208);
  if (!bVar1) {
    testing::Message::Message(&local_230);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1f377d);
    testing::internal::AssertHelper::AssertHelper
              (&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x7c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_238,&local_230);
    testing::internal::AssertHelper::~AssertHelper(&local_238);
    testing::Message::~Message((Message *)0x1f37da);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1f3832);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d0,"2djHX9wtrtdyGw9cer1u6zB6Yq4SRD8V5zw",&local_3d1);
  cfd::AddressFactory::GetAddress
            (in_stack_fffffffffffff638,
             (string *)
             CONCAT17(in_stack_fffffffffffff637,
                      CONCAT16(in_stack_fffffffffffff636,in_stack_fffffffffffff630)));
  std::__cxx11::string::~string(local_3d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_408,&local_3b0);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3e8,"address2.GetAddress().c_str()",
             "\"2djHX9wtrtdyGw9cer1u6zB6Yq4SRD8V5zw\"",pcVar3,"2djHX9wtrtdyGw9cer1u6zB6Yq4SRD8V5zw")
  ;
  std::__cxx11::string::~string((string *)&local_408);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3e8);
  if (!bVar1) {
    testing::Message::Message(&local_410);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1f39e4);
    testing::internal::AssertHelper::AssertHelper
              (&local_418,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x7f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_418,&local_410);
    testing::internal::AssertHelper::~AssertHelper(&local_418);
    testing::Message::~Message((Message *)0x1f3a41);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1f3a99);
  testing::internal::ConstCharPtr::ConstCharPtr(&local_420,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_420);
  if (bVar1) {
    local_421 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5c0,"",&local_5c1);
      cfd::AddressFactory::GetAddress
                (in_stack_fffffffffffff638,
                 (string *)
                 CONCAT17(in_stack_fffffffffffff637,
                          CONCAT16(in_stack_fffffffffffff636,in_stack_fffffffffffff630)));
      cfd::core::Address::~Address
                ((Address *)
                 CONCAT17(in_stack_fffffffffffff637,
                          CONCAT16(in_stack_fffffffffffff636,in_stack_fffffffffffff630)));
      std::__cxx11::string::~string(local_5c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
    }
    if ((local_421 & 1) == 0) {
      local_420.value =
           "Expected: factory.GetAddress(\"\") throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_001f3c5d;
    }
  }
  else {
LAB_001f3c5d:
    testing::Message::Message(local_5d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_5e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x81,local_420.value);
    testing::internal::AssertHelper::operator=(&local_5e0,local_5d8);
    testing::internal::AssertHelper::~AssertHelper(&local_5e0);
    testing::Message::~Message((Message *)0x1f3cc5);
  }
  testing::internal::ConstCharPtr::ConstCharPtr(&local_5e8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_5e8);
  if (bVar1) {
    local_5e9 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      in_stack_fffffffffffff638 = (AddressFactory *)local_789;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_789 + 1),
                 "AzpwdpR9siiDBs3nG8SNpvGQcLTHP2od4MQPugUTa3zfKHKkAVwx6M4ea2W1JovrbhuErKosFpfeuxf5",
                 (allocator *)in_stack_fffffffffffff638);
      cfd::AddressFactory::GetAddress
                (in_stack_fffffffffffff638,
                 (string *)
                 CONCAT17(in_stack_fffffffffffff637,
                          CONCAT16(in_stack_fffffffffffff636,in_stack_fffffffffffff630)));
      cfd::core::Address::~Address
                ((Address *)
                 CONCAT17(in_stack_fffffffffffff637,
                          CONCAT16(in_stack_fffffffffffff636,in_stack_fffffffffffff630)));
      std::__cxx11::string::~string((string *)(local_789 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_789);
    }
    if ((local_5e9 & 1) == 0) {
      local_5e8.value =
           "Expected: factory.GetAddress(\"AzpwdpR9siiDBs3nG8SNpvGQcLTHP2od4MQPugUTa3zfKHKkAVwx6M4ea2W1JovrbhuErKosFpfeuxf5\") throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_001f3ec2;
    }
  }
  else {
LAB_001f3ec2:
    testing::Message::Message(local_7a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_7a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x82,local_5e8.value);
    testing::internal::AssertHelper::operator=(&local_7a8,local_7a0);
    testing::internal::AssertHelper::~AssertHelper(&local_7a8);
    testing::Message::~Message((Message *)0x1f3f2a);
  }
  testing::internal::ConstCharPtr::ConstCharPtr(&local_7b0,"");
  uVar2 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_7b0);
  if ((bool)uVar2) {
    local_7b1 = 0;
    in_stack_fffffffffffff636 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffff636) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_950,"bcrt1qshc8er8ycnxn5mamc9m7acaxcasplqunvaw4f6",&local_951);
      cfd::AddressFactory::GetAddress
                (in_stack_fffffffffffff638,
                 (string *)
                 CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff636,in_stack_fffffffffffff630)));
      cfd::core::Address::~Address
                ((Address *)
                 CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff636,in_stack_fffffffffffff630)));
      std::__cxx11::string::~string(local_950);
      std::allocator<char>::~allocator((allocator<char> *)&local_951);
    }
    if ((local_7b1 & 1) != 0) goto LAB_001f41ba;
    local_7b0.value =
         "Expected: factory.GetAddress(\"bcrt1qshc8er8ycnxn5mamc9m7acaxcasplqunvaw4f6\") throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_968);
  testing::internal::AssertHelper::AssertHelper
            (&local_970,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
             ,0x83,local_7b0.value);
  testing::internal::AssertHelper::operator=(&local_970,local_968);
  testing::internal::AssertHelper::~AssertHelper(&local_970);
  testing::Message::~Message((Message *)0x1f4178);
LAB_001f41ba:
  cfd::core::Address::~Address
            ((Address *)
             CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff636,in_stack_fffffffffffff630)));
  cfd::core::Address::~Address
            ((Address *)
             CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff636,in_stack_fffffffffffff630)));
  cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x1f41e1);
  return;
}

Assistant:

TEST(ElementsAddressFactory, GetAddress)
{
  {
    ElementsAddressFactory factory(NetType::kElementsRegtest, GetElementsAddressFormatList());
    Address address = factory.GetAddress("XVHzywLC5fPS8N1216n3b2fngqqrPzKYx9");
    EXPECT_STREQ(address.GetAddress().c_str(), "XVHzywLC5fPS8N1216n3b2fngqqrPzKYx9");

    Address address2 = factory.GetAddress("2djHX9wtrtdyGw9cer1u6zB6Yq4SRD8V5zw");
    EXPECT_STREQ(address2.GetAddress().c_str(), "2djHX9wtrtdyGw9cer1u6zB6Yq4SRD8V5zw");

    EXPECT_THROW(factory.GetAddress(""), CfdException);
    EXPECT_THROW(factory.GetAddress("AzpwdpR9siiDBs3nG8SNpvGQcLTHP2od4MQPugUTa3zfKHKkAVwx6M4ea2W1JovrbhuErKosFpfeuxf5"), CfdException);
    EXPECT_THROW(factory.GetAddress("bcrt1qshc8er8ycnxn5mamc9m7acaxcasplqunvaw4f6"), CfdException);
  }
}